

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O3

LY_ERR ly_ctx_unset_searchdir_last(ly_ctx *ctx,uint32_t count)

{
  uint32_t uVar1;
  LY_ERR LVar2;
  
  if (ctx == (ly_ctx *)0x0) {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINVAL,"Invalid argument %s (%s()).","ctx",
           "ly_ctx_unset_searchdir_last");
    LVar2 = LY_EINVAL;
  }
  else {
    LVar2 = LY_SUCCESS;
    if (count != 0) {
      do {
        uVar1 = (ctx->search_paths).count;
        if (uVar1 == 0) {
          return LY_SUCCESS;
        }
        LVar2 = ly_set_rm_index(&ctx->search_paths,uVar1 - 1,free);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
        count = count - 1;
        LVar2 = LY_SUCCESS;
      } while (count != 0);
    }
  }
  return LVar2;
}

Assistant:

LIBYANG_API_DEF LY_ERR
ly_ctx_unset_searchdir_last(struct ly_ctx *ctx, uint32_t count)
{
    LY_CHECK_ARG_RET(ctx, ctx, LY_EINVAL);

    for ( ; count > 0 && ctx->search_paths.count; --count) {
        LY_CHECK_RET(ly_set_rm_index(&ctx->search_paths, ctx->search_paths.count - 1, free))
    }

    return LY_SUCCESS;
}